

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntTest.hpp
# Opt level: O0

void Qentem::Test::TestBigInt1(QTest *test)

{
  QTest *pQVar1;
  uint local_190;
  SizeT32 local_18c;
  uint local_188;
  SizeT32 local_184;
  uint local_180;
  SizeT32 local_17c;
  uint local_178;
  SizeT32 local_174;
  uint local_170;
  SizeT32 local_16c;
  uint local_168;
  SizeT32 local_164;
  uint local_160;
  SizeT32 local_15c;
  uint local_158;
  SizeT32 local_154;
  uint local_150;
  SizeT32 local_14c;
  uint local_148;
  SizeT32 local_144;
  uint local_140;
  SizeT32 local_13c;
  uint local_138;
  SizeT32 local_134;
  uint local_130;
  SizeT32 local_12c;
  uint local_128;
  SizeT32 local_124;
  uint local_120;
  SizeT32 local_11c;
  uint local_118;
  SizeT32 local_114;
  uint local_110;
  SizeT32 local_10c;
  uint local_108;
  SizeT32 local_104;
  uint local_100;
  SizeT32 local_fc;
  uint local_f8;
  SizeT32 local_f4;
  uint local_f0;
  SizeT32 local_ec;
  uint local_e8;
  SizeT32 local_e4;
  uint local_e0;
  SizeT32 local_dc;
  uint local_d8;
  SizeT32 local_d4;
  uint local_d0;
  SizeT32 local_cc;
  uint local_c8;
  SizeT32 local_c4;
  uint local_c0;
  SizeT32 local_bc;
  uint local_b8;
  SizeT32 local_b4;
  uint local_b0;
  SizeT32 local_ac;
  uint local_a8;
  SizeT32 local_a4;
  uint local_a0;
  SizeT32 local_9c;
  uint local_98;
  SizeT32 local_94;
  uint local_90;
  SizeT32 local_8c;
  uint local_88;
  SizeT32 local_84;
  uint local_80;
  SizeT32 local_7c;
  uint local_78;
  SizeT32 local_74;
  uint local_70;
  SizeT32 local_6c;
  uint local_68;
  SizeT32 local_64;
  uint local_60;
  SizeT32 local_5c;
  uint local_58;
  SizeT32 local_54;
  uint local_50;
  SizeT32 local_4c;
  uint local_48;
  SizeT32 local_44;
  uint local_40;
  SizeT32 local_3c;
  uint local_38;
  SizeT32 local_34;
  uint local_30;
  SizeT32 local_2c;
  uint local_28;
  SizeT32 local_24;
  uint local_20;
  SizeT32 local_1c;
  uint local_18;
  SizeT32 local_14;
  QTest *local_10;
  QTest *test_local;
  
  local_10 = test;
  local_14 = BigInt<unsigned_char,_128U>::SizeOfType();
  local_18 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_14,&local_18,0x53);
  pQVar1 = local_10;
  local_1c = BigInt<unsigned_char,_128U>::TypeWidth();
  local_20 = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_1c,&local_20,0x54);
  pQVar1 = local_10;
  local_24 = BigInt<unsigned_char,_128U>::TotalBits();
  local_28 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_24,&local_28,0x55);
  pQVar1 = local_10;
  local_2c = BigInt<unsigned_char,_128U>::MaxIndex();
  local_30 = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_2c,&local_30,0x56);
  pQVar1 = local_10;
  local_34 = BigInt<unsigned_char,_63U>::TypeWidth();
  local_38 = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_34,&local_38,0x58);
  pQVar1 = local_10;
  local_3c = BigInt<unsigned_char,_63U>::TotalBits();
  local_40 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_3c,&local_40,0x59);
  pQVar1 = local_10;
  local_44 = BigInt<unsigned_char,_63U>::MaxIndex();
  local_48 = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_44,&local_48,0x5a);
  pQVar1 = local_10;
  local_4c = BigInt<unsigned_char,_23U>::TypeWidth();
  local_50 = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_4c,&local_50,0x5c);
  pQVar1 = local_10;
  local_54 = BigInt<unsigned_char,_23U>::TotalBits();
  local_58 = 0x18;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_54,&local_58,0x5d);
  pQVar1 = local_10;
  local_5c = BigInt<unsigned_char,_23U>::MaxIndex();
  local_60 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_5c,&local_60,0x5e);
  pQVar1 = local_10;
  local_64 = BigInt<unsigned_short,_128U>::SizeOfType();
  local_68 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_64,&local_68,0x62);
  pQVar1 = local_10;
  local_6c = BigInt<unsigned_short,_128U>::TypeWidth();
  local_70 = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_6c,&local_70,99);
  pQVar1 = local_10;
  local_74 = BigInt<unsigned_short,_128U>::TotalBits();
  local_78 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_74,&local_78,100);
  pQVar1 = local_10;
  local_7c = BigInt<unsigned_short,_128U>::MaxIndex();
  local_80 = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_7c,&local_80,0x65);
  pQVar1 = local_10;
  local_84 = BigInt<unsigned_short,_63U>::TypeWidth();
  local_88 = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_84,&local_88,0x67);
  pQVar1 = local_10;
  local_8c = BigInt<unsigned_short,_63U>::TotalBits();
  local_90 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_8c,&local_90,0x68);
  pQVar1 = local_10;
  local_94 = BigInt<unsigned_short,_63U>::MaxIndex();
  local_98 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_94,&local_98,0x69);
  pQVar1 = local_10;
  local_9c = BigInt<unsigned_short,_120U>::TypeWidth();
  local_a0 = 0x10;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_9c,&local_a0,0x6b);
  pQVar1 = local_10;
  local_a4 = BigInt<unsigned_short,_120U>::TotalBits();
  local_a8 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_a4,&local_a8,0x6c);
  pQVar1 = local_10;
  local_ac = BigInt<unsigned_short,_120U>::MaxIndex();
  local_b0 = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_ac,&local_b0,0x6d);
  pQVar1 = local_10;
  local_b4 = BigInt<unsigned_int,_128U>::SizeOfType();
  local_b8 = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_b4,&local_b8,0x71);
  pQVar1 = local_10;
  local_bc = BigInt<unsigned_int,_128U>::TypeWidth();
  local_c0 = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_bc,&local_c0,0x72);
  pQVar1 = local_10;
  local_c4 = BigInt<unsigned_int,_128U>::TotalBits();
  local_c8 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_c4,&local_c8,0x73);
  pQVar1 = local_10;
  local_cc = BigInt<unsigned_int,_128U>::MaxIndex();
  local_d0 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_cc,&local_d0,0x74);
  pQVar1 = local_10;
  local_d4 = BigInt<unsigned_int,_1024U>::SizeOfType();
  local_d8 = 4;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_d4,&local_d8,0x76);
  pQVar1 = local_10;
  local_dc = BigInt<unsigned_int,_1024U>::TypeWidth();
  local_e0 = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_dc,&local_e0,0x77);
  pQVar1 = local_10;
  local_e4 = BigInt<unsigned_int,_1024U>::TotalBits();
  local_e8 = 0x400;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_e4,&local_e8,0x78);
  pQVar1 = local_10;
  local_ec = BigInt<unsigned_int,_1024U>::MaxIndex();
  local_f0 = 0x1f;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_ec,&local_f0,0x79);
  pQVar1 = local_10;
  local_f4 = BigInt<unsigned_int,_63U>::TypeWidth();
  local_f8 = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_f4,&local_f8,0x7b);
  pQVar1 = local_10;
  local_fc = BigInt<unsigned_int,_63U>::TotalBits();
  local_100 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_fc,&local_100,0x7c);
  pQVar1 = local_10;
  local_104 = BigInt<unsigned_int,_63U>::MaxIndex();
  local_108 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_104,&local_108,0x7d);
  pQVar1 = local_10;
  local_10c = BigInt<unsigned_int,_120U>::TypeWidth();
  local_110 = 0x20;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_10c,&local_110,0x7f);
  pQVar1 = local_10;
  local_114 = BigInt<unsigned_int,_120U>::TotalBits();
  local_118 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_114,&local_118,0x80);
  pQVar1 = local_10;
  local_11c = BigInt<unsigned_int,_120U>::MaxIndex();
  local_120 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_11c,&local_120,0x81);
  pQVar1 = local_10;
  local_124 = BigInt<unsigned_long_long,_128U>::SizeOfType();
  local_128 = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_124,&local_128,0x85);
  pQVar1 = local_10;
  local_12c = BigInt<unsigned_long_long,_128U>::TypeWidth();
  local_130 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_12c,&local_130,0x86);
  pQVar1 = local_10;
  local_134 = BigInt<unsigned_long_long,_128U>::TotalBits();
  local_138 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_134,&local_138,0x87);
  pQVar1 = local_10;
  local_13c = BigInt<unsigned_long_long,_128U>::MaxIndex();
  local_140 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_13c,&local_140,0x88);
  pQVar1 = local_10;
  local_144 = BigInt<unsigned_long_long,_1024U>::SizeOfType();
  local_148 = 8;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_144,&local_148,0x8a);
  pQVar1 = local_10;
  local_14c = BigInt<unsigned_long_long,_1024U>::TypeWidth();
  local_150 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_14c,&local_150,0x8b);
  pQVar1 = local_10;
  local_154 = BigInt<unsigned_long_long,_1024U>::TotalBits();
  local_158 = 0x400;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_154,&local_158,0x8c);
  pQVar1 = local_10;
  local_15c = BigInt<unsigned_long_long,_1024U>::MaxIndex();
  local_160 = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_15c,&local_160,0x8d);
  pQVar1 = local_10;
  local_164 = BigInt<unsigned_long_long,_15U>::TypeWidth();
  local_168 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_164,&local_168,0x8f);
  pQVar1 = local_10;
  local_16c = BigInt<unsigned_long_long,_15U>::TotalBits();
  local_170 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_16c,&local_170,0x90);
  pQVar1 = local_10;
  local_174 = BigInt<unsigned_long_long,_15U>::MaxIndex();
  local_178 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_174,&local_178,0x91);
  pQVar1 = local_10;
  local_17c = BigInt<unsigned_long_long,_120U>::TypeWidth();
  local_180 = 0x40;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_17c,&local_180,0x93);
  pQVar1 = local_10;
  local_184 = BigInt<unsigned_long_long,_120U>::TotalBits();
  local_188 = 0x80;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_184,&local_188,0x94);
  pQVar1 = local_10;
  local_18c = BigInt<unsigned_long_long,_120U>::MaxIndex();
  local_190 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQVar1,&local_18c,&local_190,0x95);
  return;
}

Assistant:

static void TestBigInt1(QTest &test) {
    test.IsEqual(BigInt_8_128::SizeOfType(), 1U, __LINE__);
    test.IsEqual(BigInt_8_128::TypeWidth(), 8U, __LINE__);
    test.IsEqual(BigInt_8_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_8_128::MaxIndex(), 15U, __LINE__);

    test.IsEqual(BigInt_8_63::TypeWidth(), 8U, __LINE__);
    test.IsEqual(BigInt_8_63::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_8_63::MaxIndex(), 7U, __LINE__);

    test.IsEqual(BigInt_8_23::TypeWidth(), 8U, __LINE__);
    test.IsEqual(BigInt_8_23::TotalBits(), 24U, __LINE__);
    test.IsEqual(BigInt_8_23::MaxIndex(), 2U, __LINE__);

    //////////////////////////////

    test.IsEqual(BigInt_16_128::SizeOfType(), 2U, __LINE__);
    test.IsEqual(BigInt_16_128::TypeWidth(), 16U, __LINE__);
    test.IsEqual(BigInt_16_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_16_128::MaxIndex(), 7U, __LINE__);

    test.IsEqual(BigInt_16_63::TypeWidth(), 16U, __LINE__);
    test.IsEqual(BigInt_16_63::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_16_63::MaxIndex(), 3U, __LINE__);

    test.IsEqual(BigInt_16_120::TypeWidth(), 16U, __LINE__);
    test.IsEqual(BigInt_16_120::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_16_120::MaxIndex(), 7U, __LINE__);

    //////////////////////////////

    test.IsEqual(BigInt_32_128::SizeOfType(), 4U, __LINE__);
    test.IsEqual(BigInt_32_128::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_32_128::MaxIndex(), 3U, __LINE__);

    test.IsEqual(BigInt_32_1024::SizeOfType(), 4U, __LINE__);
    test.IsEqual(BigInt_32_1024::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_1024::TotalBits(), 1024U, __LINE__);
    test.IsEqual(BigInt_32_1024::MaxIndex(), 31U, __LINE__);

    test.IsEqual(BigInt_32_63::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_63::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_32_63::MaxIndex(), 1U, __LINE__);

    test.IsEqual(BigInt_32_120::TypeWidth(), 32U, __LINE__);
    test.IsEqual(BigInt_32_120::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_32_120::MaxIndex(), 3U, __LINE__);

    //////////////////////////////

    test.IsEqual(BigInt_64_128::SizeOfType(), 8U, __LINE__);
    test.IsEqual(BigInt_64_128::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_128::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_64_128::MaxIndex(), 1U, __LINE__);

    test.IsEqual(BigInt_64_1024::SizeOfType(), 8U, __LINE__);
    test.IsEqual(BigInt_64_1024::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_1024::TotalBits(), 1024U, __LINE__);
    test.IsEqual(BigInt_64_1024::MaxIndex(), 15U, __LINE__);

    test.IsEqual(BigInt_64_15::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_15::TotalBits(), 64U, __LINE__);
    test.IsEqual(BigInt_64_15::MaxIndex(), 0U, __LINE__);

    test.IsEqual(BigInt_64_120::TypeWidth(), 64U, __LINE__);
    test.IsEqual(BigInt_64_120::TotalBits(), 128U, __LINE__);
    test.IsEqual(BigInt_64_120::MaxIndex(), 1U, __LINE__);
}